

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O2

void run_container_remove_range(run_container_t *run,uint32_t min,uint32_t max)

{
  int iVar1;
  uint16_t ikey;
  uint16_t ikey_00;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  int lenarray;
  int iVar5;
  rle16_t *prVar6;
  
  prVar6 = run->runs;
  lenarray = run->n_runs;
  ikey = (uint16_t)min;
  uVar2 = rle16_find_run(prVar6,lenarray,ikey);
  ikey_00 = (uint16_t)max;
  uVar3 = rle16_find_run(prVar6,lenarray,ikey_00);
  if ((int)uVar2 < 0) {
    uVar2 = ~uVar2;
  }
  else {
    uVar4 = prVar6[uVar2].value;
    if (uVar4 < min) {
      if (max < (uint)prVar6[uVar2].length + (uint)uVar4) {
        makeRoomAtIndex(run,(short)uVar2 + 1);
        prVar6 = run->runs;
        prVar6[(ulong)uVar2 + 1].value = ikey_00 + 1;
        uVar4 = prVar6[uVar2].value;
        prVar6[(ulong)uVar2 + 1].length = ~ikey_00 + uVar4 + prVar6[uVar2].length;
        prVar6[uVar2].length = ~uVar4 + ikey;
        return;
      }
      prVar6[uVar2].length = ~uVar4 + ikey;
      uVar2 = uVar2 + 1;
    }
  }
  if ((int)uVar3 < 0) {
    uVar3 = -uVar3 - 2;
  }
  else {
    uVar4 = prVar6[uVar3].length + prVar6[uVar3].value;
    if (max < uVar4) {
      prVar6[uVar3].value = ikey_00 + 1;
      prVar6[uVar3].length = uVar4 - (ikey_00 + 1);
      uVar3 = uVar3 - 1;
    }
  }
  if ((int)uVar2 <= (int)uVar3) {
    uVar3 = ~uVar3;
    iVar1 = lenarray + uVar3;
    iVar5 = uVar2 + uVar3;
    if ((iVar5 != 0 && SCARRY4(uVar2,uVar3) == iVar5 < 0) && (run->capacity < iVar5 + iVar1)) {
      run_container_grow(run,iVar5 + iVar1,true);
      lenarray = run->n_runs;
      prVar6 = run->runs;
    }
    memmove(prVar6 + ((lenarray - iVar1) + iVar5),prVar6 + (lenarray - iVar1),(long)iVar1 << 2);
    run->n_runs = run->n_runs + iVar5;
  }
  return;
}

Assistant:

static inline void run_container_remove_range(run_container_t *run,
                                              uint32_t min, uint32_t max) {
    int32_t first = rle16_find_run(run->runs, run->n_runs, (uint16_t)min);
    int32_t last = rle16_find_run(run->runs, run->n_runs, (uint16_t)max);

    if (first >= 0 && min > run->runs[first].value &&
        max < ((uint32_t)run->runs[first].value +
               (uint32_t)run->runs[first].length)) {
        // split this run into two adjacent runs

        // right subinterval
        makeRoomAtIndex(run, (uint16_t)(first + 1));
        run->runs[first + 1].value = (uint16_t)(max + 1);
        run->runs[first + 1].length =
            (uint16_t)((run->runs[first].value + run->runs[first].length) -
                       (max + 1));

        // left subinterval
        run->runs[first].length =
            (uint16_t)((min - 1) - run->runs[first].value);

        return;
    }

    // update left-most partial run
    if (first >= 0) {
        if (min > run->runs[first].value) {
            run->runs[first].length =
                (uint16_t)((min - 1) - run->runs[first].value);
            first++;
        }
    } else {
        first = -first - 1;
    }

    // update right-most run
    if (last >= 0) {
        uint16_t run_max = run->runs[last].value + run->runs[last].length;
        if (run_max > max) {
            run->runs[last].value = (uint16_t)(max + 1);
            run->runs[last].length = (uint16_t)(run_max - (max + 1));
            last--;
        }
    } else {
        last = (-last - 1) - 1;
    }

    // remove intermediate runs
    if (first <= last) {
        run_container_shift_tail(run, run->n_runs - (last + 1),
                                 -(last - first + 1));
    }
}